

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_deref(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
               lyxp_set *set,int options)

{
  lyxp_set_type lVar1;
  lys_node *plVar2;
  char *pcVar3;
  int iVar4;
  
  lVar1 = (*args)->type;
  if (lVar1 < LYXP_SET_BOOLEAN) {
    if ((options & 0x1cU) == 0) {
      iVar4 = 0;
      lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,param_4,options);
      if ((*args)->type != LYXP_SET_EMPTY) {
        plVar2 = (((*args)->val).snodes)->snode;
        if (((plVar2->name[0x38] & 0xcU) != 0) &&
           ((*(uint *)(plVar2->name + 0x80) & 0xfffffffe) == 8)) {
          if (((ulong)plVar2->parent & 0xc0) == 0) {
            iVar4 = 0;
            set_insert_node(set,*(void **)&plVar2->nodetype,0,LYXP_NODE_ELEM,0);
          }
          else {
            iVar4 = -1;
            ly_vlog(LYE_SPEC,LY_VLOG_LYD,plVar2,
                    "Trying to dereference an unresolved leafref or instance-identifier.");
          }
        }
      }
    }
    else {
      if (lVar1 != LYXP_SET_SNODE_SET) {
        __assert_fail("args[0]->type == LYXP_SET_SNODE_SET",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0xb2a,
                      "int xpath_deref(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      set_snode_clear_ctx(set);
      plVar2 = (((*args)->val).snodes)->snode;
      if (((plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
         (iVar4._0_2_ = plVar2[1].flags, iVar4._2_1_ = plVar2[1].ext_size,
         iVar4._3_1_ = plVar2[1].iffeature_size, iVar4 == 9)) {
        if ((*(long *)&plVar2[1].nodetype == 0) || (plVar2[1].parent == (lys_node *)0x0)) {
          __assert_fail("sleaf->type.info.lref.path && sleaf->type.info.lref.target",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                        ,0xb2f,
                        "int xpath_deref(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        set_insert_node(set,plVar2[1].parent,0,LYXP_NODE_ELEM,0);
      }
      set_snode_insert_node(set,(lys_node *)cur_node,LYXP_NODE_ELEM);
      iVar4 = 0;
    }
  }
  else {
    pcVar3 = print_set_type(*args);
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar3,"deref(node-set)");
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int
xpath_deref(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
            struct lyxp_set *set, int options)
{
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_SNODE_SET)
            && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "deref(node-set)");
        return -1;
    }

    if (options & LYXP_SNODE_ALL) {
        assert(args[0]->type == LYXP_SET_SNODE_SET);
        set_snode_clear_ctx(set);

        sleaf = (struct lys_node_leaf *)args[0]->val.snodes[0].snode;
        if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_LEAFREF)) {
            assert(sleaf->type.info.lref.path && sleaf->type.info.lref.target);
            set_insert_node(set, sleaf->type.info.lref.target, 0, LYXP_NODE_ELEM, 0);
        }
        set_snode_insert_node(set, (struct lys_node *)cur_node, LYXP_NODE_ELEM);
    } else {
        lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        if (args[0]->type != LYXP_SET_EMPTY) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[0].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                    && ((sleaf->type.base == LY_TYPE_LEAFREF) || (sleaf->type.base == LY_TYPE_INST))) {
                if (leaf->value_type & (LY_TYPE_LEAFREF_UNRES | LY_TYPE_INST_UNRES)) {
                    /* this is bad */
                    LOGVAL(LYE_SPEC, LY_VLOG_LYD, args[0]->val.nodes[0].node,
                           "Trying to dereference an unresolved leafref or instance-identifier.");
                    return -1;
                }
                /* works for both leafref and instid */
                set_insert_node(set, leaf->value.leafref, 0, LYXP_NODE_ELEM, 0);
            }
        }
    }

    return EXIT_SUCCESS;
}